

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcmd_od.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
  *this_00;
  _Manager_type *this_01;
  pointer *ppcVar2;
  value_type v;
  char cVar3;
  element_type *peVar4;
  int iVar5;
  size_type sVar6;
  bool bVar7;
  __type_conflict _Var8;
  bool bVar9;
  bool bVar10;
  __type_conflict _Var11;
  ostream *poVar12;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var13;
  pointer pbVar14;
  basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  long lVar15;
  char *extraout_RDX;
  char *s;
  char *s_00;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar16;
  char *extraout_RDX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_01;
  char *s_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *s_03;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_08;
  char *s_09;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *s_10;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_11;
  char *s_12;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *s_13;
  char *extraout_RDX_17;
  char *s_14;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  char *s_15;
  char *extraout_RDX_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_16;
  char *s_17;
  char *extraout_RDX_21;
  char *extraout_RDX_22;
  char *extraout_RDX_23;
  char *s_18;
  char *extraout_RDX_24;
  char *extraout_RDX_25;
  char *extraout_RDX_26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_19;
  char *s_20;
  char *extraout_RDX_27;
  char *extraout_RDX_28;
  char *extraout_RDX_29;
  char *s_21;
  char *extraout_RDX_30;
  char *extraout_RDX_31;
  char *extraout_RDX_32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_22;
  char *s_23;
  char *extraout_RDX_33;
  char *extraout_RDX_34;
  char *s_24;
  char *extraout_RDX_35;
  char *s_25;
  char *extraout_RDX_36;
  char *extraout_RDX_37;
  char *s_26;
  char *extraout_RDX_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_27;
  char *s_28;
  char *extraout_RDX_39;
  char *extraout_RDX_40;
  char *s_29;
  char *extraout_RDX_41;
  char *s_30;
  char *extraout_RDX_42;
  char *extraout_RDX_43;
  char *s_31;
  char *extraout_RDX_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *f_3;
  string *psVar17;
  pointer pbVar18;
  _Alloc_hider _Var19;
  char *e;
  pointer pcVar20;
  size_type sVar21;
  pointer psVar22;
  argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *paVar23;
  argument_order in_R9D;
  char *e_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar24;
  char *e_6;
  pointer pbVar25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *long_name;
  ulong uVar26;
  pointer psVar27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e_3;
  value_type *pvVar28;
  pointer pbVar29;
  undefined1 auVar30 [16];
  initializer_list<char> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<char> __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<char> __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<char> __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<char> __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<char> __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  allocator local_19db;
  allocator local_19da;
  allocator local_19d9;
  pointer local_19d8;
  allocator local_19ce;
  allocator local_19cd;
  allocator local_19cc;
  allocator local_19cb;
  allocator local_19ca;
  allocator local_19c9;
  string_type name;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  match;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argument_args;
  allocator local_194e;
  allocator local_194d;
  allocator local_194c;
  allocator local_194b;
  allocator local_194a;
  allocator local_1949;
  string_type err;
  string local_1928 [40];
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1900;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  partial_matches;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  subcommand_arg;
  allocator local_1889;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1888;
  shared_ptr<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>_>
  connectOpts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  help_1;
  string local_1828 [32];
  tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
  local_1808;
  shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  greetOpts;
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  f_1;
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  fStack_1610;
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
  fStack_1568;
  argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  aStack_14b8;
  undefined4 local_1478 [8];
  string local_1458 [32];
  string local_1438 [32];
  argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  a;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1398;
  _Alloc_hider local_1388;
  pointer pbStack_1380;
  undefined1 local_1378 [72];
  undefined1 local_1330 [104];
  undefined1 local_12c8 [304];
  subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1198;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>
  connectCmd;
  basic_command<_2815e3e1_> cmd;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  greetCmd;
  undefined1 local_3e8 [32];
  _Alloc_hider local_3c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3c0;
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a8;
  subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_300;
  
  std::__cxx11::string::string((string *)&err,"subcmd_od greet",&local_19c9);
  std::__cxx11::string::string((string *)&match,"Greeting command",&local_19ca);
  std::__cxx11::string::string((string *)&help_1,(string *)&err);
  std::__cxx11::string::string(local_1828,(string *)&match);
  local_19d9 = (allocator)0x3f;
  std::__cxx11::string::string((string *)&name,"help",&local_19da);
  std::__cxx11::string::string((string *)&args,"",&local_19cb);
  std::__cxx11::string::string((string *)&argument_args,"display this help and exit",&local_19cc);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_19d9;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&a,__l,(allocator_type *)&connectCmd);
  __l_00._M_len = 1;
  __l_00._M_array = &name;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&a.placeholder.field_2 + 8),__l_00,(allocator_type *)&partial_matches);
  std::__cxx11::string::string((string *)&a.read.super__Function_base._M_manager,(string *)&args);
  std::__cxx11::string::string((string *)local_13c8._M_local_buf,(string *)&argument_args);
  local_1398._M_allocated_capacity = 0;
  local_1398._8_8_ = 0;
  local_13a8._M_allocated_capacity = 0;
  local_13a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pbStack_1380 = (pointer)std::
                          _Function_handler<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonsugar::value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>_>
                          ::_M_invoke;
  local_1388._M_p =
       (pointer)std::
                _Function_handler<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonsugar::value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>_>
                ::_M_manager;
  local_1378[0] = true;
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
  ::flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
          *)&connectCmd,
         (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
          *)&a);
  std::__cxx11::string::string((string *)&f_1,(string *)&help_1);
  this = &f_1.long_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::string((string *)this,local_1828);
  paVar1 = &f_1.placeholder.field_2;
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
  ::flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
          *)paVar1,
         (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
          *)&connectCmd);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
  ::~flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
           *)&connectCmd);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
  ::~flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
           *)&a);
  local_19db = (allocator)0x67;
  std::__cxx11::string::string((string *)&partial_matches,"greet",&local_19cd);
  std::__cxx11::string::string((string *)&subcommand_arg,"STRING",&local_1949);
  std::__cxx11::string::string((string *)&local_1888,"greeting message",&local_194a);
  std::__cxx11::string::string((string *)&greetOpts,"Hello",&local_194b);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_19db;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&connectCmd,__l_01,(allocator_type *)&a);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&partial_matches;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&connectCmd.m_header.field_2 + 8),__l_02,(allocator_type *)&connectOpts);
  local_19d8 = (pointer)CONCAT44(local_19d8._4_4_,argc);
  std::__cxx11::string::string
            ((string *)connectCmd.m_footer.field_2._M_local_buf,(string *)&subcommand_arg);
  std::__cxx11::string::string
            ((string *)
             ((long)&connectCmd.m_flags.
                     super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                     .
                     super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                     .
                     super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                     .
                     super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
                     ._M_head_impl + 0x10),(string *)&local_1888);
  std::make_shared<std::__cxx11::string,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&connectCmd.m_flags.
                     super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                     .
                     super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                     .
                     super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                     .
                     super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
                     ._M_head_impl + 0x30));
  connectCmd.m_flags.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
  ._M_head_impl.placeholder.field_2._M_allocated_capacity = 0;
  connectCmd.m_flags.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
  ._M_head_impl.placeholder.field_2._8_8_ = 0;
  connectCmd.m_flags.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
  ._M_head_impl.help._M_string_length =
       (size_type)
       std::
       _Function_handler<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonsugar::value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
       ::_M_invoke;
  connectCmd.m_flags.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
  ._M_head_impl.help._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonsugar::value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                ::_M_manager;
  connectCmd.m_flags.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
  ._M_head_impl.help.field_2._M_local_buf[0] = '\0';
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&a,(flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&connectCmd);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
  ::flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
          *)(local_1378 + 8),
         (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
          *)paVar1);
  std::__cxx11::string::string((string *)local_3e8,(string *)&f_1);
  std::__cxx11::string::string((string *)&local_3c8,(string *)this);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::flag(&local_3a8,
         (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&a);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
  ::flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
          *)&local_300,
         (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
          *)(local_1378 + 8));
  std::
  _Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&a);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&connectCmd);
  std::__cxx11::string::string((string *)&connectOpts,"decorate",&local_194c);
  std::__cxx11::string::string(local_1438,"",&local_19ce);
  std::__cxx11::string::string(local_1458,"decorate message",&local_194d);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&connectCmd,(initializer_list<char>)ZEXT816(0),
             (allocator_type *)&a);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&connectOpts;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&connectCmd.m_header.field_2 + 8),__l_03,(allocator_type *)local_1478);
  std::__cxx11::string::string((string *)connectCmd.m_footer.field_2._M_local_buf,local_1438);
  std::__cxx11::string::string
            ((string *)
             ((long)&connectCmd.m_flags.
                     super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                     .
                     super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                     .
                     super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                     .
                     super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
                     ._M_head_impl + 0x10),local_1458);
  connectCmd.m_flags.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
  ._M_head_impl.placeholder.field_2._M_allocated_capacity = 0;
  connectCmd.m_flags.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
  ._M_head_impl.placeholder.field_2._8_8_ = 0;
  connectCmd.m_flags.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
  ._M_head_impl.placeholder._M_dataplus._M_p = (pointer)0x0;
  connectCmd.m_flags.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
  ._M_head_impl.placeholder._M_string_length = 0;
  connectCmd.m_flags.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
  ._M_head_impl.help._M_string_length =
       (size_type)
       std::
       _Function_handler<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonsugar::value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>_>
       ::_M_invoke;
  connectCmd.m_flags.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
  ._M_head_impl.help._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonsugar::value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>_>
                ::_M_manager;
  connectCmd.m_flags.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  .
  super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
  ._M_head_impl.help.field_2._M_local_buf[0] = '\0';
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>
  ::flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>
          *)&a,(flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>
                *)&connectCmd);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)(local_1378 + 8),&local_3a8);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
  ::flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
          *)local_12c8,
         (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
          *)&local_300);
  std::__cxx11::string::string((string *)&cmd,(string *)local_3e8);
  std::__cxx11::string::string((string *)&cmd.m_footer,(string *)&local_3c8);
  std::
  tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
  ::tuple((tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
           *)&cmd.m_flags,
          (tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
           *)&a);
  std::
  _Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                  *)&a);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>
  ::~flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>
           *)&connectCmd);
  std::__cxx11::string::string((string *)local_1478,"NAME",&local_194e);
  std::__cxx11::string::string((string *)&a,(string *)local_1478);
  a.read.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  a.read.super__Function_base._M_functor._8_8_ = 0;
  a.read._M_invoker =
       std::
       _Function_handler<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonsugar::value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
       ::_M_invoke;
  a.read.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonsugar::value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
       ::_M_manager;
  nonsugar::detail::
  argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::argument((argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&connectCmd,&a);
  std::__cxx11::string::string((string *)&greetCmd,(string *)&cmd);
  std::__cxx11::string::string((string *)&greetCmd.m_footer,(string *)&cmd.m_footer);
  std::
  tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
  ::tuple(&greetCmd.m_flags,
          (tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
           *)&cmd.m_flags);
  std::
  tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::tuple(&greetCmd.m_arguments,
          (tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&connectCmd);
  nonsugar::detail::
  argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~argument((argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&connectCmd);
  nonsugar::detail::
  argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~argument(&a);
  std::__cxx11::string::~string((string *)local_1478);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<>_>
                    *)&cmd);
  std::__cxx11::string::~string(local_1458);
  std::__cxx11::string::~string(local_1438);
  std::__cxx11::string::~string((string *)&connectOpts);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::tuple<>,_std::tuple<>_>
                    *)local_3e8);
  std::__cxx11::string::~string((string *)&greetOpts);
  std::__cxx11::string::~string((string *)&local_1888);
  std::__cxx11::string::~string((string *)&subcommand_arg);
  std::__cxx11::string::~string((string *)&partial_matches);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>_>,_std::tuple<>,_std::tuple<>_>
                    *)&f_1);
  std::__cxx11::string::~string((string *)&argument_args);
  std::__cxx11::string::~string((string *)&args);
  std::__cxx11::string::~string((string *)&name);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
                    *)&help_1);
  std::__cxx11::string::~string((string *)&match);
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::string((string *)&err,"subcmd_od connect",&local_19ca);
  std::__cxx11::string::string((string *)&match,"Connect command",&local_19d9);
  std::__cxx11::string::string((string *)&help_1,(string *)&err);
  std::__cxx11::string::string(local_1828,(string *)&match);
  local_19da = (allocator)0x3f;
  std::__cxx11::string::string((string *)&name,"help",&local_19cb);
  std::__cxx11::string::string((string *)&args,"",&local_19cc);
  std::__cxx11::string::string((string *)&argument_args,"display this help and exit",&local_19db);
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&local_19da;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&cmd,__l_04,(allocator_type *)&f_1);
  __l_05._M_len = 1;
  __l_05._M_array = &name;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&cmd.m_header.field_2 + 8),__l_05,(allocator_type *)&partial_matches);
  std::__cxx11::string::string((string *)cmd.m_footer.field_2._M_local_buf,(string *)&args);
  std::__cxx11::string::string
            ((string *)
             ((long)&cmd.m_flags.
                     super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
                     .
                     super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
                     ._M_head_impl.short_names.super__Vector_base<char,_std::allocator<char>_> +
             0x10),(string *)&argument_args);
  cmd.m_flags.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
  ._M_head_impl.placeholder.field_2._M_allocated_capacity = 0;
  cmd.m_flags.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
  ._M_head_impl.placeholder.field_2._8_8_ = 0;
  cmd.m_flags.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
  ._M_head_impl.placeholder._M_dataplus._M_p = (pointer)0x0;
  cmd.m_flags.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
  ._M_head_impl.placeholder._M_string_length = 0;
  cmd.m_flags.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
  ._M_head_impl.help._M_string_length =
       (size_type)
       std::
       _Function_handler<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonsugar::value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>_>
       ::_M_invoke;
  cmd.m_flags.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
  ._M_head_impl.help._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonsugar::value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>_>
                ::_M_manager;
  cmd.m_flags.
  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
  .
  super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
  ._M_head_impl.help.field_2._M_local_buf[0] = '\x01';
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
  ::flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
          *)&f_1,(flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
                  *)&cmd);
  std::__cxx11::string::string((string *)local_3e8,(string *)&help_1);
  std::__cxx11::string::string((string *)&local_3c8,local_1828);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
  ::flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
          *)&local_3a8,
         (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
          *)&f_1);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
  ::~flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
           *)&f_1);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
  ::~flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
           *)&cmd);
  local_19cd = (allocator)0x68;
  std::__cxx11::string::string((string *)&partial_matches,"host",&local_1949);
  std::__cxx11::string::string((string *)&subcommand_arg,"HOST",&local_194a);
  std::__cxx11::string::string((string *)&local_1888,"host name",&local_194b);
  std::__cxx11::string::string((string *)&greetOpts,"localhost",&local_194c);
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&local_19cd;
  std::vector<char,_std::allocator<char>_>::vector(&f_1.short_names,__l_06,(allocator_type *)&cmd);
  __l_07._M_len = 1;
  __l_07._M_array = (iterator)&partial_matches;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&f_1.long_names,__l_07,(allocator_type *)&connectOpts);
  std::__cxx11::string::string((string *)&f_1.placeholder,(string *)&subcommand_arg);
  std::__cxx11::string::string((string *)&f_1.help,(string *)&local_1888);
  std::make_shared<std::__cxx11::string,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1.default_value
            );
  f_1.read.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  f_1.read.super__Function_base._M_functor._8_8_ = 0;
  f_1.read._M_invoker =
       std::
       _Function_handler<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonsugar::value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
       ::_M_invoke;
  f_1.read.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonsugar::value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
       ::_M_manager;
  f_1.exclusive = false;
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&cmd,&f_1);
  this_00 = (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
             *)((long)&cmd.m_flags.
                       super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
                       .
                       super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
                       ._M_head_impl.help.field_2 + 8);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
  ::flag(this_00,(flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
                  *)&local_3a8);
  std::__cxx11::string::string((string *)&a,(string *)local_3e8);
  std::__cxx11::string::string((string *)&a.read,(string *)&local_3c8);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_13d8,
         (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&cmd);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
  ::flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
          *)local_1330,this_00);
  std::
  _Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&cmd);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~flag(&f_1);
  local_19ce = (allocator)0x70;
  std::__cxx11::string::string((string *)&connectOpts,"port",&local_194d);
  std::__cxx11::string::string(local_1438,"PORT",&local_194e);
  std::__cxx11::string::string(local_1458,"port number",&local_1889);
  local_1478[0] = 0x1f90;
  __l_08._M_len = 1;
  __l_08._M_array = (iterator)&local_19ce;
  std::vector<char,_std::allocator<char>_>::vector(&f_1.short_names,__l_08,(allocator_type *)&cmd);
  __l_09._M_len = 1;
  __l_09._M_array = (iterator)&connectOpts;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&f_1.long_names,__l_09,(allocator_type *)&local_19c9);
  std::__cxx11::string::string((string *)&f_1.placeholder,local_1438);
  std::__cxx11::string::string((string *)&f_1.help,local_1458);
  std::make_shared<int,int_const&>((int *)&f_1.default_value);
  f_1.read.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  f_1.read.super__Function_base._M_functor._8_8_ = 0;
  f_1.read._M_invoker =
       std::
       _Function_handler<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonsugar::value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>_>
       ::_M_invoke;
  f_1.read.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonsugar::value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>_>
       ::_M_manager;
  f_1.exclusive = false;
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>
  ::flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>
          *)&cmd,(flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>
                  *)&f_1);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)((long)&cmd.m_flags.
                    super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
                    .
                    super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
                    ._M_head_impl.help.field_2 + 8),
         (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_13d8);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
  ::flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
          *)((long)&cmd.m_subcommands.
                    super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
                    .
                    super__Tuple_impl<1UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
                    .
                    super__Head_base<1UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>,_false>
                    ._M_head_impl.command + 0x28),
         (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
          *)local_1330);
  std::__cxx11::string::string((string *)&connectCmd,(string *)&a);
  std::__cxx11::string::string((string *)&connectCmd.m_footer,(string *)&a.read);
  std::
  tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  ::tuple(&connectCmd.m_flags,
          (tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
           *)&cmd);
  std::
  _Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                  *)&cmd);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>
  ::~flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>
           *)&f_1);
  std::__cxx11::string::~string(local_1458);
  std::__cxx11::string::~string(local_1438);
  std::__cxx11::string::~string((string *)&connectOpts);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::tuple<>,_std::tuple<>_>
                    *)&a);
  std::__cxx11::string::~string((string *)&greetOpts);
  std::__cxx11::string::~string((string *)&local_1888);
  std::__cxx11::string::~string((string *)&subcommand_arg);
  std::__cxx11::string::~string((string *)&partial_matches);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>_>,_std::tuple<>,_std::tuple<>_>
                    *)local_3e8);
  std::__cxx11::string::~string((string *)&argument_args);
  std::__cxx11::string::~string((string *)&args);
  std::__cxx11::string::~string((string *)&name);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
                    *)&help_1);
  std::__cxx11::string::~string((string *)&match);
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::string((string *)&match,"subcmd_od",(allocator *)local_1438);
  std::__cxx11::string::string
            ((string *)&name,"Test program for sub commands",(allocator *)local_1458);
  std::__cxx11::string::string((string *)&err,(string *)&match);
  std::__cxx11::string::string(local_1928,(string *)&name);
  local_1478[0] = CONCAT31(local_1478[0]._1_3_,0x3f);
  std::__cxx11::string::string((string *)&args,"help",&local_19c9);
  std::__cxx11::string::string((string *)&argument_args,"",&local_19ca);
  std::__cxx11::string::string((string *)&partial_matches,"display this help and exit",&local_19d9);
  __l_10._M_len = 1;
  __l_10._M_array = (iterator)local_1478;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&a,__l_10,(allocator_type *)&f_1);
  __l_11._M_len = 1;
  __l_11._M_array = (iterator)&args;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&a.placeholder.field_2 + 8),__l_11,(allocator_type *)&subcommand_arg);
  this_01 = &a.read.super__Function_base._M_manager;
  std::__cxx11::string::string((string *)this_01,(string *)&argument_args);
  std::__cxx11::string::string((string *)local_13c8._M_local_buf,(string *)&partial_matches);
  f_1.help._M_string_length = local_13c8._8_8_;
  local_1398._M_allocated_capacity = 0;
  local_1398._8_8_ = 0;
  local_1378[0] = true;
  f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = a.placeholder._M_dataplus._M_p;
  f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)a.placeholder._M_string_length;
  f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)a.placeholder.field_2._M_allocated_capacity;
  a.placeholder.field_2._M_allocated_capacity = 0;
  a.placeholder._M_dataplus._M_p = (pointer)0x0;
  a.placeholder._M_string_length = 0;
  f_1.long_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)a.placeholder.field_2._8_8_;
  f_1.long_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)a.read.super__Function_base._M_functor._M_unused._0_8_;
  f_1.long_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)a.read.super__Function_base._M_functor._8_8_;
  a.read.super__Function_base._M_functor._8_8_ = 0;
  a.placeholder.field_2._8_8_ = 0;
  a.read.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)a.read.super__Function_base._M_manager == &local_13d8) {
    f_1.placeholder.field_2._8_8_ = local_13d8._8_8_;
    f_1.placeholder._M_dataplus._M_p = (pointer)&f_1.placeholder.field_2;
  }
  else {
    f_1.placeholder._M_dataplus._M_p = (pointer)a.read.super__Function_base._M_manager;
  }
  f_1.help._M_dataplus._M_p = (pointer)&f_1.help.field_2;
  f_1.placeholder._M_string_length = (size_type)a.read._M_invoker;
  a.read._M_invoker = (_Invoker_type)0x0;
  local_13d8._M_allocated_capacity = local_13d8._M_allocated_capacity & 0xffffffffffffff00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13c8._M_allocated_capacity == &local_13b8) {
    f_1.help.field_2._8_8_ = local_13b8._8_8_;
  }
  else {
    f_1.help._M_dataplus._M_p = (pointer)local_13c8._M_allocated_capacity;
  }
  local_13c8._8_8_ = 0;
  local_13b8._M_allocated_capacity = local_13b8._M_allocated_capacity & 0xffffffffffffff00;
  f_1.default_value.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  f_1.default_value.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_13a8._M_allocated_capacity = 0;
  local_13a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  f_1.read._M_invoker =
       std::
       _Function_handler<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonsugar::value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>_>
       ::_M_invoke;
  f_1.read.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  f_1.read.super__Function_base._M_functor._8_8_ = 0;
  f_1.read.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonsugar::value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>_>
       ::_M_manager;
  local_1388._M_p = (pointer)0x0;
  pbStack_1380 = (pointer)0x0;
  f_1.exclusive = true;
  a.read.super__Function_base._M_manager = (_Manager_type)&local_13d8;
  local_13c8._M_allocated_capacity = (size_type)&local_13b8;
  std::__cxx11::string::string((string *)&help_1,(string *)&err);
  std::__cxx11::string::string(local_1828,local_1928);
  std::
  tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
  ::tuple(&local_1808,
          (tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
           *)&f_1);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>
  ::~flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>
           *)&f_1);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>
  ::~flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>
           *)&a);
  std::__cxx11::string::string((string *)&subcommand_arg,"greet",&local_19da);
  std::__cxx11::string::string((string *)&local_1888,"Greeting command",&local_19cb);
  std::__cxx11::string::string((string *)&a,(string *)&subcommand_arg);
  std::__cxx11::string::string((string *)&a.read,(string *)&local_1888);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_13d8,&greetCmd);
  f_1.placeholder.field_2._8_8_ = local_13d8._8_8_;
  f_1.long_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)a.read.super__Function_base._M_functor._8_8_;
  f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)a.placeholder._M_string_length;
  f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  paVar1 = &a.placeholder.field_2;
  f_1.long_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = &f_1.placeholder;
  f_1.help.field_2._M_allocated_capacity = (size_type)&f_1.default_value;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)a.placeholder._M_dataplus._M_p == paVar1) {
    f_1.long_names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)a.placeholder.field_2._8_8_;
  }
  else {
    f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = a.placeholder._M_dataplus._M_p;
  }
  f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)a.placeholder.field_2._M_allocated_capacity;
  a.placeholder._M_string_length = 0;
  a.placeholder.field_2._M_allocated_capacity =
       a.placeholder.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if ((_Manager_type *)a.read.super__Function_base._M_functor._M_unused._0_8_ == this_01) {
    f_1.placeholder._M_string_length = (size_type)a.read._M_invoker;
  }
  else {
    f_1.long_names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)a.read.super__Function_base._M_functor._M_unused._0_8_;
  }
  f_1.placeholder._M_dataplus._M_p = (pointer)a.read.super__Function_base._M_manager;
  f_1.placeholder.field_2._M_allocated_capacity = (size_type)&f_1.help;
  a.read.super__Function_base._M_functor._8_8_ = 0;
  a.read.super__Function_base._M_manager =
       (_Manager_type)((ulong)a.read.super__Function_base._M_manager & 0xffffffffffffff00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13d8._M_allocated_capacity == &local_13c8) {
    f_1.help._M_string_length = local_13c8._8_8_;
  }
  else {
    f_1.placeholder.field_2._M_allocated_capacity = local_13d8._M_allocated_capacity;
  }
  f_1.help._M_dataplus._M_p = (pointer)local_13c8._M_allocated_capacity;
  local_13d8._8_8_ = 0;
  local_13c8._M_allocated_capacity = local_13c8._M_allocated_capacity & 0xffffffffffffff00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13b8._M_allocated_capacity == &local_13a8) {
    f_1.default_value.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_13a8._8_8_;
  }
  else {
    f_1.help.field_2._M_allocated_capacity = local_13b8._M_allocated_capacity;
  }
  f_1.default_value.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_13a8._M_allocated_capacity;
  f_1.help.field_2._8_8_ = local_13b8._8_8_;
  local_13b8._8_8_ = 0;
  local_13a8._M_allocated_capacity = local_13a8._M_allocated_capacity & 0xffffffffffffff00;
  a.placeholder._M_dataplus._M_p = (pointer)paVar1;
  a.read.super__Function_base._M_functor._M_unused._M_object = this_01;
  local_13d8._M_allocated_capacity = (size_type)&local_13c8;
  local_13b8._M_allocated_capacity = (size_type)&local_13a8;
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>
  ::flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>
          *)&f_1.read,
         (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>
          *)&local_1398);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::flag(&fStack_1610,
         (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)(local_1330 + 0x40));
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
  ::flag(&fStack_1568,
         (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>
          *)(local_12c8 + 0x80));
  nonsugar::detail::
  argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::argument(&aStack_14b8,
             (argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1198);
  std::__cxx11::string::string((string *)local_3e8,(string *)&help_1);
  std::__cxx11::string::string((string *)&local_3c8,local_1828);
  std::
  tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
  ::tuple((tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
           *)&local_3a8,&local_1808);
  nonsugar::detail::
  subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::subcommand(&local_300,
               (subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&f_1);
  nonsugar::detail::
  subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~subcommand((subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&f_1);
  nonsugar::detail::
  subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~subcommand((subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&a);
  std::__cxx11::string::string((string *)&greetOpts,"connect",&local_19cc);
  std::__cxx11::string::string((string *)&connectOpts,"Connect command",&local_19db);
  std::__cxx11::string::string((string *)&f_1,(string *)&greetOpts);
  std::__cxx11::string::string
            ((string *)
             &f_1.long_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,(string *)&connectOpts);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>
  ::basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>
                   *)&f_1.placeholder.field_2,&connectCmd);
  local_13d8._8_8_ = f_1.placeholder.field_2._8_8_;
  a.read.super__Function_base._M_functor._8_8_ =
       f_1.long_names.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  a.placeholder._M_string_length =
       (size_type)
       f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  a.placeholder._M_dataplus._M_p = (pointer)&a.placeholder.field_2;
  ppcVar2 = &f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  if ((pointer *)
      f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start == ppcVar2) {
    a.placeholder.field_2._8_8_ =
         f_1.long_names.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    a.placeholder._M_dataplus._M_p =
         f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  a.placeholder.field_2._M_allocated_capacity =
       (size_type)
       f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  iVar5 = (int)local_19d8;
  f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)((ulong)f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  if (f_1.long_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == &f_1.placeholder) {
    a.read._M_invoker = (_Invoker_type)f_1.placeholder._M_string_length;
    a.read.super__Function_base._M_functor._M_unused._M_object = this_01;
  }
  else {
    a.read.super__Function_base._M_functor._M_unused._M_object =
         f_1.long_names.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  a.read.super__Function_base._M_manager = (_Manager_type)f_1.placeholder._M_dataplus._M_p;
  f_1.long_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f_1.placeholder._M_dataplus._M_p = f_1.placeholder._M_dataplus._M_p & 0xffffffffffffff00;
  local_13d8._M_allocated_capacity = (size_type)&local_13c8;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      f_1.placeholder.field_2._M_allocated_capacity == &f_1.help) {
    local_13c8._8_8_ = f_1.help._M_string_length;
  }
  else {
    local_13d8._M_allocated_capacity = f_1.placeholder.field_2._M_allocated_capacity;
  }
  local_13c8._M_allocated_capacity = (size_type)f_1.help._M_dataplus._M_p;
  f_1.placeholder.field_2._8_8_ = 0;
  f_1.help._M_dataplus._M_p = f_1.help._M_dataplus._M_p & 0xffffffffffffff00;
  if ((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)f_1.help.field_2._M_allocated_capacity == &f_1.default_value) {
    local_13a8._8_8_ =
         f_1.default_value.
         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_13b8._M_allocated_capacity = (size_type)&local_13a8;
  }
  else {
    local_13b8._M_allocated_capacity = f_1.help.field_2._M_allocated_capacity;
  }
  local_13a8._M_allocated_capacity =
       (size_type)
       f_1.default_value.
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  local_13b8._8_8_ = f_1.help.field_2._8_8_;
  f_1.help.field_2._8_8_ = 0;
  f_1.default_value.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            ((ulong)f_1.default_value.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr & 0xffffffffffffff00);
  f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppcVar2;
  f_1.long_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = &f_1.placeholder;
  f_1.placeholder.field_2._M_allocated_capacity = (size_type)&f_1.help;
  f_1.help.field_2._M_allocated_capacity = (size_type)&f_1.default_value;
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>
  ::flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>
          *)&local_1398,
         (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>
          *)&f_1.read);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)(local_1330 + 0x40),
         (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&fStack_1610);
  nonsugar::detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
  ::flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
          *)(local_12c8 + 0x80),
         (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>
          *)&fStack_1568);
  nonsugar::detail::
  subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::subcommand(&local_1198,&local_300);
  std::__cxx11::string::string((string *)&cmd,(string *)local_3e8);
  std::__cxx11::string::string((string *)&cmd.m_footer,(string *)&local_3c8);
  std::
  tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
  ::tuple(&cmd.m_flags,
          (tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
           *)&local_3a8);
  std::__cxx11::string::string((string *)&cmd.m_subcommands,(string *)&a);
  std::__cxx11::string::string
            ((string *)
             &cmd.m_subcommands.
              super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
              .
              super__Tuple_impl<1UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
              .
              super__Head_base<1UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>,_false>
              ._M_head_impl.help,(string *)&a.read);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>
  ::basic_command(&cmd.m_subcommands.
                   super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
                   .
                   super__Tuple_impl<1UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
                   .
                   super__Head_base<1UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>,_false>
                   ._M_head_impl.command,
                  (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>
                   *)&local_13d8);
  nonsugar::detail::
  subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::subcommand(&cmd.m_subcommands.
                super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
                .
                super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_false>
                ._M_head_impl,&local_1198);
  std::
  _Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
                  *)&a);
  nonsugar::detail::
  subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>
  ::~subcommand((subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>
                 *)&f_1);
  std::__cxx11::string::~string((string *)&connectOpts);
  std::__cxx11::string::~string((string *)&greetOpts);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::tuple<>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::tuple<>_>
                    *)local_3e8);
  std::__cxx11::string::~string((string *)&local_1888);
  std::__cxx11::string::~string((string *)&subcommand_arg);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>,_std::tuple<>,_std::tuple<>_>
                    *)&help_1);
  std::__cxx11::string::~string((string *)&partial_matches);
  std::__cxx11::string::~string((string *)&argument_args);
  std::__cxx11::string::~string((string *)&args);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
                    *)&err);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&match);
  local_3c8._M_p = (pointer)0x0;
  _Stack_3c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3e8._16_8_ =
       (option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  local_3e8._24_8_ = (pointer)0x0;
  local_3e8._0_8_ = (pointer)0x0;
  local_3e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)local_3e8,
             &cmd.m_flags.
              super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
              .
              super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
              ._M_head_impl.default_value.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char*const*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
             argv + (0 < iVar5),argv + iVar5,(allocator_type *)&a);
  local_1900._M_current =
       args.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  subcommand_arg.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  subcommand_arg.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  argument_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  argument_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  argument_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_19d8 = (pointer)0x0;
  _Var13._M_current =
       args.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pcVar16 = extraout_RDX;
  while( true ) {
    if (_Var13._M_current == local_1900._M_current) break;
    nonsugar::detail::widen<std::__cxx11::string>(&a.placeholder,(detail *)0x138290,pcVar16);
    _Var8 = std::operator==(_Var13._M_current,&a.placeholder);
    std::__cxx11::string::~string((string *)&a);
    if (_Var8) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&argument_args
                 ,(const_iterator)
                  argument_args.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,_Var13._M_current + 1,local_1900);
      break;
    }
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    match._M_begin._M_current = (char *)0x0;
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    nonsugar::detail::widen<std::__cxx11::string>((string *)&f_1,(detail *)"--([^=]+)(?:=(.*))?",s);
    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&a,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,0x10);
    bVar9 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (_Var13._M_current,&match,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&a,0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&a);
    std::__cxx11::string::~string((string *)&f_1);
    if (bVar9) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&name,&match,1);
      pbVar14 = cmd.m_flags.
                super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
                .
                super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
                ._M_head_impl.long_names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      partial_matches.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      partial_matches.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      partial_matches.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar9 = false;
      for (pbVar18 = cmd.m_flags.
                     super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
                     .
                     super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
                     ._M_head_impl.long_names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar25 = cmd.m_flags.
                    super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
                    .
                    super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
                    ._M_head_impl.long_names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish, pbVar18 != pbVar14;
          pbVar18 = pbVar18 + 1) {
        _Var8 = std::operator==(&name,pbVar18);
        if (_Var8) {
          bVar7 = true;
          if (bVar9) {
            auVar30 = __cxa_allocate_exception(0x28);
            nonsugar::detail::widen<std::__cxx11::string>
                      ((string *)&help_1,(detail *)": ambiguous option: --",auVar30._8_8_);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1
                           ,&cmd.m_header,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &help_1);
            std::operator+(&a.placeholder,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1
                           ,&name);
            nonsugar::
            basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::basic_error(auVar30._0_8_,&a.placeholder);
            __cxa_throw(auVar30._0_8_,&nonsugar::basic_error<std::__cxx11::string>::typeinfo,
                        nonsugar::
                        basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~basic_error);
          }
        }
        else {
          bVar10 = nonsugar::detail::starts_with<std::__cxx11::string>(pbVar18,&name);
          bVar7 = bVar9;
          if (bVar10) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&partial_matches,pbVar18);
          }
        }
        bVar9 = bVar7;
      }
      pbVar24 = cmd.m_flags.
                super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
                .
                super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
                ._M_head_impl.long_names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (!bVar9) {
        if (partial_matches.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            partial_matches.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          auVar30 = __cxa_allocate_exception(0x28);
          nonsugar::detail::widen<std::__cxx11::string>
                    ((string *)&help_1,(detail *)": unrecognized option: --",auVar30._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                         &cmd.m_header,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &help_1);
          std::operator+(&a.placeholder,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                         &name);
          nonsugar::
          basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::basic_error(auVar30._0_8_,&a.placeholder);
          __cxa_throw(auVar30._0_8_,&nonsugar::basic_error<std::__cxx11::string>::typeinfo,
                      nonsugar::
                      basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~basic_error);
        }
        if (0x20 < (ulong)((long)partial_matches.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)partial_matches.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          std::__cxx11::stringstream::stringstream((stringstream *)&a);
          paVar1 = &a.placeholder.field_2;
          poVar12 = std::operator<<((ostream *)paVar1->_M_local_buf,(string *)&cmd);
          poVar12 = std::operator<<(poVar12,": ambiguous option: --");
          poVar12 = std::operator<<(poVar12,(string *)&name);
          std::operator<<(poVar12," [");
          pbVar14 = partial_matches.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          bVar9 = true;
          for (pbVar18 = partial_matches.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar18 != pbVar14;
              pbVar18 = pbVar18 + 1) {
            if (!bVar9) {
              std::operator<<((ostream *)paVar1->_M_local_buf,", ");
            }
            poVar12 = std::operator<<((ostream *)paVar1->_M_local_buf,"--");
            std::operator<<(poVar12,(string *)pbVar18);
            bVar9 = false;
          }
          std::operator<<((ostream *)paVar1->_M_local_buf,"]");
          this_02 = (basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          nonsugar::
          basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::basic_error(this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&f_1);
          __cxa_throw(this_02,&nonsugar::basic_error<std::__cxx11::string>::typeinfo,
                      nonsugar::
                      basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~basic_error);
        }
      }
      for (; pbVar24 != pbVar25; pbVar24 = pbVar24 + 1) {
        if (bVar9) {
          _Var8 = std::operator==(&name,pbVar24);
          pcVar16 = extraout_RDX_00;
        }
        else {
          _Var8 = nonsugar::detail::starts_with<std::__cxx11::string>(pbVar24,&name);
          pcVar16 = extraout_RDX_01;
        }
        if (_Var8 != false) {
          err._M_dataplus._M_p = (pointer)&err.field_2;
          err._M_string_length = 0;
          err.field_2._M_allocated_capacity = err.field_2._M_allocated_capacity & 0xffffffffffffff00
          ;
          lVar15 = (long)match.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)match.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if ((lVar15 == 0) ||
             (pcVar16 = (char *)(lVar15 % 0x18), 0xfffffffffffffffc < lVar15 / 0x18 - 6U)) {
            psVar22 = (pointer)((long)match.
                                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar15 + -0x48);
          }
          else {
            psVar22 = match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 2;
          }
          if (psVar22->matched == true) {
            nonsugar::detail::widen<std::__cxx11::string>
                      ((string *)&f_1,(detail *)"argument not allowed: ",pcVar16);
            std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::str((string_type *)&help_1,&match,0);
            std::operator+(&a.placeholder,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1
                           ,(string_type *)&help_1);
            std::__cxx11::string::operator=((string *)&err,(string *)&a);
            std::__cxx11::string::~string((string *)&a);
            std::__cxx11::string::~string((string *)&help_1);
            std::__cxx11::string::~string((string *)&f_1);
          }
          else {
            std::make_shared<int>();
            std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)local_3e8,
                       (__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)&a);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&a.placeholder._M_string_length
                      );
          }
          if (err._M_string_length != 0) {
            auVar30 = __cxa_allocate_exception(0x28);
            nonsugar::detail::widen<std::__cxx11::string>
                      ((string *)&help_1,(detail *)0x138c15,auVar30._8_8_);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1
                           ,&cmd.m_header,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &help_1);
            std::operator+(&a.placeholder,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1
                           ,&err);
            nonsugar::
            basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::basic_error(auVar30._0_8_,&a.placeholder);
            __cxa_throw(auVar30._0_8_,&nonsugar::basic_error<std::__cxx11::string>::typeinfo,
                        nonsugar::
                        basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~basic_error);
          }
          local_19d8 = (pointer)CONCAT71((int7)((ulong)local_19d8 >> 8),
                                         (byte)local_19d8 |
                                         cmd.m_flags.
                                         super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
                                         .
                                         super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
                                         ._M_head_impl.exclusive);
          std::__cxx11::string::~string((string *)&err);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&partial_matches);
      std::__cxx11::string::~string((string *)&name);
LAB_00121020:
      bVar9 = true;
    }
    else {
      nonsugar::detail::widen<std::__cxx11::string>((string *)&f_1,(detail *)"-(.+)",s_00);
      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
      basic_regex<std::char_traits<char>,std::allocator<char>>
                ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&a,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,0x10);
      bVar9 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        (_Var13._M_current,&match,
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&a,0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&a);
      std::__cxx11::string::~string((string *)&f_1);
      if (bVar9) {
        lVar15 = (long)match.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)match.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if ((lVar15 == 0) || (0xfffffffffffffffd < lVar15 / 0x18 - 5U)) {
          psVar22 = (pointer)((long)match.
                                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar15 + -0x48);
        }
        else {
          psVar22 = match.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        pvVar28 = (psVar22->
                  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ).first._M_current;
        while( true ) {
          lVar15 = (long)match.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)match.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if ((lVar15 == 0) || (0xfffffffffffffffd < lVar15 / 0x18 - 5U)) {
            psVar22 = (pointer)((long)match.
                                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar15 + -0x48);
          }
          else {
            psVar22 = match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          if (pvVar28 ==
              (psVar22->
              super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).second._M_current) break;
          v = *pvVar28;
          bVar9 = nonsugar::detail::contains<std::vector<char,std::allocator<char>>>
                            ((vector<char,_std::allocator<char>_> *)&cmd.m_flags,v);
          if (!bVar9) {
            auVar30 = __cxa_allocate_exception(0x28);
            nonsugar::detail::widen<std::__cxx11::string>
                      ((string *)&help_1,(detail *)": unrecognized option: -",auVar30._8_8_);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1
                           ,&cmd.m_header,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &help_1);
            std::operator+(&a.placeholder,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1
                           ,v);
            nonsugar::
            basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::basic_error(auVar30._0_8_,&a.placeholder);
            __cxa_throw(auVar30._0_8_,&nonsugar::basic_error<std::__cxx11::string>::typeinfo,
                        nonsugar::
                        basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~basic_error);
          }
          bVar9 = nonsugar::detail::contains<std::vector<char,std::allocator<char>>>
                            ((vector<char,_std::allocator<char>_> *)&cmd.m_flags,v);
          if (bVar9) {
            a.placeholder._M_string_length = 0;
            a.placeholder.field_2._M_allocated_capacity =
                 a.placeholder.field_2._M_allocated_capacity & 0xffffffffffffff00;
            a.placeholder._M_dataplus._M_p = (pointer)&a.placeholder.field_2;
            std::make_shared<int>();
            std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)local_3e8,
                       (__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)&f_1);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish);
            if (a.placeholder._M_string_length != 0) {
              auVar30 = __cxa_allocate_exception(0x28);
              nonsugar::detail::widen<std::__cxx11::string>(&err,(detail *)0x138c15,auVar30._8_8_);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &help_1,&cmd.m_header,&err);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &f_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&help_1,&a.placeholder);
              nonsugar::
              basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::basic_error(auVar30._0_8_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &f_1);
              __cxa_throw(auVar30._0_8_,&nonsugar::basic_error<std::__cxx11::string>::typeinfo,
                          nonsugar::
                          basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~basic_error);
            }
            local_19d8 = (pointer)CONCAT71((int7)((ulong)local_19d8 >> 8),
                                           (byte)local_19d8 |
                                           cmd.m_flags.
                                           super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
                                           .
                                           super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
                                           ._M_head_impl.exclusive);
            std::__cxx11::string::~string((string *)&a);
          }
          pvVar28 = pvVar28 + 1;
        }
        goto LAB_00121020;
      }
      if (subcommand_arg.
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        std::make_shared<std::__cxx11::string,std::__cxx11::string_const&>(&a.placeholder);
        std::
        __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ::operator=(&subcommand_arg.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ,(__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      *)&a);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&a.placeholder._M_string_length);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &argument_args,
                   (const_iterator)
                   argument_args.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,_Var13._M_current + 1,local_1900);
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &argument_args,
                   (const_iterator)
                   argument_args.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,_Var13,local_1900);
      }
      bVar9 = false;
    }
    std::
    _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&match);
    if (!bVar9) break;
    _Var13._M_current = _Var13._M_current + 1;
    pcVar16 = extraout_RDX_02;
  }
  pbVar18 = argument_args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar14 = argument_args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)local_19d8 & 1) == 0) {
    if (subcommand_arg.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      auVar30 = __cxa_allocate_exception(0x28);
      nonsugar::detail::widen<std::__cxx11::string>
                ((string *)&f_1,(detail *)": command required",auVar30._8_8_);
      std::operator+(&a.placeholder,&cmd.m_header,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1);
      nonsugar::
      basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::basic_error(auVar30._0_8_,&a.placeholder);
      __cxa_throw(auVar30._0_8_,&nonsugar::basic_error<std::__cxx11::string>::typeinfo,
                  nonsugar::
                  basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~basic_error);
    }
    _Var8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &cmd.m_subcommands.
                             super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
                             .
                             super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_false>
                            ,subcommand_arg.
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
    _Var11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &cmd.m_subcommands,
                             subcommand_arg.
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
    if (_Var11) {
      if (_Var8) {
        auVar30 = __cxa_allocate_exception(0x28);
        nonsugar::detail::widen<std::__cxx11::string>
                  ((string *)&help_1,(detail *)": ambiguous command: ",auVar30._8_8_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                       &cmd.m_header,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help_1)
        ;
        std::operator+(&a.placeholder,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                       subcommand_arg.
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
        nonsugar::
        basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::basic_error(auVar30._0_8_,&a.placeholder);
        __cxa_throw(auVar30._0_8_,&nonsugar::basic_error<std::__cxx11::string>::typeinfo,
                    nonsugar::
                    basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~basic_error);
      }
    }
    else if (!_Var8) {
      auVar30 = __cxa_allocate_exception(0x28);
      nonsugar::detail::widen<std::__cxx11::string>
                ((string *)&help_1,(detail *)": unrecognized command: ",auVar30._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                     &cmd.m_header,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help_1);
      std::operator+(&a.placeholder,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                     subcommand_arg.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
      nonsugar::
      basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::basic_error(auVar30._0_8_,&a.placeholder);
      __cxa_throw(auVar30._0_8_,&nonsugar::basic_error<std::__cxx11::string>::typeinfo,
                  nonsugar::
                  basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~basic_error);
    }
    _Var8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &cmd.m_subcommands.
                             super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
                             .
                             super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_false>
                            ,subcommand_arg.
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
    if (_Var8) {
      nonsugar::
      parse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,main::GreetOption,std::tuple<nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)2,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>>>
                ((type *)&a,(nonsugar *)pbVar14,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )pbVar18,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )&cmd.m_subcommands.
                    super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
                    .
                    super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_false>
                    ._M_head_impl.command,
                 (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x0,in_R9D);
      nonsugar::detail::
      copy_shared<nonsugar::option_map<main::GreetOption,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)2,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>>
                ((detail *)&help_1,
                 (option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&a);
      f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_3e8._24_8_;
      f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_3e8._16_8_;
      local_3e8._24_8_ =
           help_1.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_3e8._16_8_ =
           help_1.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      help_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      help_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &help_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      nonsugar::
      option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~option_map((option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&a);
    }
    _Var8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &cmd.m_subcommands,
                            subcommand_arg.
                            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
    if (_Var8) {
      nonsugar::
      parse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,main::ConnectOption,std::tuple<nonsugar::detail::flag<std::__cxx11::string,main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::flag<std::__cxx11::string,main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::flag<std::__cxx11::string,main::ConnectOption,(main::ConnectOption)2,int>>,std::tuple<>,std::tuple<>>>
                ((type *)&a,(nonsugar *)pbVar14,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )pbVar18,
                 &cmd.m_subcommands.
                  super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
                  .
                  super__Tuple_impl<1UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
                  .
                  super__Head_base<1UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>,_false>
                  ._M_head_impl.command.m_header,
                 (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>
                  *)0x0,in_R9D);
      nonsugar::detail::
      copy_shared<nonsugar::option_map<main::ConnectOption,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)2,int>>>
                ((detail *)&help_1,
                 (option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>
                  *)&a);
      f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)_Stack_3c0._M_pi;
      f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = local_3c8._M_p;
      _Stack_3c0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           help_1.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_3c8._M_p =
           (pointer)help_1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      help_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      help_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &help_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      nonsugar::
      option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>
      ::~option_map((option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>
                     *)&a);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&argument_args);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&subcommand_arg.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  if ((pointer)local_3e8._0_8_ != (pointer)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&a);
    paVar1 = &a.placeholder.field_2;
    poVar12 = std::operator<<((ostream *)paVar1->_M_local_buf,"Usage: ");
    std::operator<<(poVar12,(string *)&cmd);
    std::operator<<((ostream *)paVar1->_M_local_buf," [OPTION...]");
    std::operator<<((ostream *)paVar1->_M_local_buf," COMMAND [ARG...]");
    std::operator<<((ostream *)paVar1->_M_local_buf,"\n");
    nonsugar::detail::lines<std::__cxx11::string>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&f_1,(detail *)&cmd.m_footer,s_01);
    pcVar20 = f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (psVar17 = (string *)
                   f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start; psVar17 != (string *)pcVar20;
        psVar17 = psVar17 + 0x20) {
      poVar12 = std::operator<<((ostream *)paVar1->_M_local_buf,"  ");
      poVar12 = std::operator<<(poVar12,psVar17);
      std::operator<<(poVar12,"\n");
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&f_1);
    std::operator<<((ostream *)paVar1->_M_local_buf,"\nOptions:\n");
    argument_args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    argument_args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    argument_args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    nonsugar::detail::widen<std::__cxx11::string>((string *)&match,(detail *)", ",s_02);
    err._M_dataplus._M_p = (pointer)&err.field_2;
    err._M_string_length = 0;
    err.field_2._M_allocated_capacity = err.field_2._M_allocated_capacity & 0xffffffffffffff00;
    bVar9 = true;
    pcVar16 = extraout_RDX_03;
    for (pcVar20 = cmd.m_flags.
                   super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
                   .
                   super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
                   ._M_head_impl.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl
                   .super__Vector_impl_data._M_start;
        pcVar20 !=
        cmd.m_flags.
        super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
        .
        super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
        ._M_head_impl.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish; pcVar20 = pcVar20 + 1) {
      if (!bVar9) {
        std::__cxx11::string::append((string *)&err);
        pcVar16 = extraout_RDX_04;
      }
      cVar3 = *pcVar20;
      nonsugar::detail::widen<std::__cxx11::string>((string *)&f_1,(detail *)0x138c42,pcVar16);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,cVar3
                    );
      std::__cxx11::string::~string((string *)&f_1);
      std::__cxx11::string::append((string *)&err);
      std::__cxx11::string::~string((string *)&help_1);
      bVar9 = false;
      pcVar16 = extraout_RDX_05;
    }
    std::__cxx11::string::~string((string *)&match);
    nonsugar::detail::widen<std::__cxx11::string>(&name,(detail *)", ",s_03);
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&match.
                   super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)match.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    bVar9 = true;
    pcVar16 = extraout_RDX_06;
    for (pbVar14 = cmd.m_flags.
                   super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
                   .
                   super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
                   ._M_head_impl.long_names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar14 !=
        cmd.m_flags.
        super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
        .
        super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
        ._M_head_impl.long_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar14 = pbVar14 + 1) {
      if (!bVar9) {
        std::__cxx11::string::append((string *)&match);
        pcVar16 = extraout_RDX_07;
      }
      nonsugar::detail::widen<std::__cxx11::string>((string *)&f_1,(detail *)0x138290,pcVar16);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                     pbVar14);
      std::__cxx11::string::~string((string *)&f_1);
      std::__cxx11::string::append((string *)&match);
      std::__cxx11::string::~string((string *)&help_1);
      bVar9 = false;
      pcVar16 = extraout_RDX_08;
    }
    std::__cxx11::string::~string((string *)&name);
    nonsugar::detail::lines<std::__cxx11::string>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&name,(detail *)
                        &cmd.m_flags.
                         super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>
                         .
                         super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>,_false>
                         ._M_head_impl.help,s_04);
    _Var19 = name._M_dataplus;
    pbVar24 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              name._M_string_length;
    if (name._M_dataplus._M_p == (pointer)name._M_string_length) {
      f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
      f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1);
      std::__cxx11::string::~string((string *)&f_1);
      _Var19 = name._M_dataplus;
      pbVar24 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                name._M_string_length;
    }
    bVar9 = true;
    for (; sVar21 = err._M_string_length,
        psVar22 = match.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var19._M_p != pbVar24;
        _Var19._M_p = _Var19._M_p + 0x20) {
      if (bVar9) {
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
        ::
        emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                  ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                    *)&argument_args,&err,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&match,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var19._M_p)
        ;
      }
      else {
        f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)f_1.short_names.super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00
                      );
        help_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&help_1.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        help_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        help_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string_const&>
                  ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                    *)&argument_args,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var19._M_p)
        ;
        std::__cxx11::string::~string((string *)&help_1);
        std::__cxx11::string::~string((string *)&f_1);
      }
      bVar9 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&name);
    std::__cxx11::string::~string((string *)&match);
    std::__cxx11::string::~string((string *)&err);
    local_19d8 = argument_args.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar14 = argument_args.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar14 != local_19d8;
        pbVar14 = pbVar14 + 3) {
      poVar12 = std::operator<<((ostream *)paVar1->_M_local_buf,"  ");
      std::operator<<(poVar12,(string *)(pbVar14 + 2));
      for (uVar26 = pbVar14[2]._M_string_length; uVar26 < sVar21; uVar26 = uVar26 + 1) {
        std::operator<<((ostream *)paVar1->_M_local_buf," ");
      }
      poVar12 = std::operator<<((ostream *)paVar1->_M_local_buf,"  ");
      std::operator<<(poVar12,(string *)(pbVar14 + 1));
      for (psVar27 = (pointer)pbVar14[1]._M_string_length; psVar27 < psVar22;
          psVar27 = (pointer)((long)&(psVar27->
                                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ).first._M_current + 1)) {
        std::operator<<((ostream *)paVar1->_M_local_buf," ");
      }
      poVar12 = std::operator<<((ostream *)paVar1->_M_local_buf,"  ");
      poVar12 = std::operator<<(poVar12,(string *)pbVar14);
      std::operator<<(poVar12,"\n");
    }
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&argument_args);
    std::operator<<((ostream *)paVar1->_M_local_buf,"\nCommands:\n");
    err._M_dataplus._M_p = (pointer)0x0;
    err._M_string_length = 0;
    err.field_2._M_allocated_capacity = 0;
    nonsugar::detail::lines<std::__cxx11::string>
              (&help_1,(detail *)
                       &cmd.m_subcommands.
                        super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
                        .
                        super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_false>
                        ._M_head_impl.help,s_05);
    if (help_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        help_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
      f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&help_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1);
      std::__cxx11::string::~string((string *)&f_1);
    }
    pbVar14 = help_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar9 = true;
    for (pbVar18 = help_1.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar18 != pbVar14;
        pbVar18 = pbVar18 + 1) {
      if (bVar9) {
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
                    *)&err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &cmd.m_subcommands.
                            super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
                            .
                            super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_false>
                   ,pbVar18);
      }
      else {
        f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)f_1.short_names.super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00
                      );
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::__cxx11::string,std::__cxx11::string_const&>
                  ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
                    *)&err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1
                   ,pbVar18);
        std::__cxx11::string::~string((string *)&f_1);
      }
      bVar9 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&help_1);
    nonsugar::detail::lines<std::__cxx11::string>
              (&help_1,(detail *)
                       &cmd.m_subcommands.
                        super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
                        .
                        super__Tuple_impl<1UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
                        .
                        super__Head_base<1UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>,_false>
                        ._M_head_impl.help,s_06);
    if (help_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        help_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
      f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&help_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1);
      std::__cxx11::string::~string((string *)&f_1);
    }
    pbVar14 = help_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar9 = true;
    for (pbVar18 = help_1.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar18 != pbVar14;
        pbVar18 = pbVar18 + 1) {
      if (bVar9) {
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
                    *)&err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &cmd.m_subcommands,pbVar18);
      }
      else {
        f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)f_1.short_names.super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00
                      );
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::__cxx11::string,std::__cxx11::string_const&>
                  ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
                    *)&err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1
                   ,pbVar18);
        std::__cxx11::string::~string((string *)&f_1);
      }
      bVar9 = false;
    }
    sVar21 = cmd.m_subcommands.
             super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
             .
             super__Tuple_impl<1UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
             .
             super__Head_base<1UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>,_false>
             ._M_head_impl.name._M_string_length;
    if (cmd.m_subcommands.
        super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
        .
        super__Tuple_impl<1UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
        .
        super__Head_base<1UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>,_false>
        ._M_head_impl.name._M_string_length <
        cmd.m_subcommands.
        super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
        .
        super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_false>
        ._M_head_impl.name._M_string_length) {
      sVar21 = cmd.m_subcommands.
               super__Tuple_impl<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)2,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>_>_>
               .
               super__Head_base<0UL,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_false>
               ._M_head_impl.name._M_string_length;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&help_1);
    sVar6 = err._M_string_length;
    for (_Var19 = err._M_dataplus; _Var19._M_p != (pointer)sVar6; _Var19._M_p = _Var19._M_p + 0x40)
    {
      poVar12 = std::operator<<((ostream *)paVar1->_M_local_buf,"  ");
      std::operator<<(poVar12,(string *)_Var19._M_p + 0x20);
      for (uVar26 = *(ulong *)((string *)_Var19._M_p + 0x28); uVar26 < sVar21; uVar26 = uVar26 + 1)
      {
        std::operator<<((ostream *)paVar1->_M_local_buf," ");
      }
      poVar12 = std::operator<<((ostream *)paVar1->_M_local_buf,"  ");
      poVar12 = std::operator<<(poVar12,(string *)_Var19._M_p);
      std::operator<<(poVar12,"\n");
    }
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&err);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&a);
    poVar12 = std::operator<<((ostream *)&std::cout,(string *)&args);
    std::endl<char,std::char_traits<char>>(poVar12);
    std::__cxx11::string::~string((string *)&args);
    goto LAB_001235e4;
  }
  if ((option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_3e8._16_8_ ==
      (option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    greetOpts.
    super___shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    greetOpts.
    super___shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00121c85:
    if ((option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>
         *)local_3c8._M_p ==
        (option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>
         *)0x0) {
      connectOpts.
      super___shared_ptr<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      connectOpts.
      super___shared_ptr<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      nonsugar::detail::
      copy_shared<nonsugar::option_map<main::ConnectOption,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)2,int>>>
                ((detail *)&connectOpts,
                 (option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>
                  *)local_3c8._M_p);
      if (connectOpts.
          super___shared_ptr<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)0x0) {
        if (((connectOpts.
              super___shared_ptr<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->super_option_pair<ConnectOption,_(ConnectOption)0,_void>).value.
            super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
          std::__cxx11::string::string
                    ((string *)&help_1,
                     (string *)
                     ((connectOpts.
                       super___shared_ptr<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->
                     super_option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ).value.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &help_1,":");
          std::__cxx11::to_string
                    (&err,*((connectOpts.
                             super___shared_ptr<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->super_option_pair<ConnectOption,_(ConnectOption)2,_int>).value
                           .super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          std::operator+(&a.placeholder,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                         &err);
          std::__cxx11::string::~string((string *)&err);
          std::__cxx11::string::~string((string *)&f_1);
          std::__cxx11::string::~string((string *)&help_1);
          poVar12 = std::operator<<((ostream *)&std::cout,"connect to ");
          poVar12 = std::operator<<(poVar12,(string *)&a);
          std::endl<char,std::char_traits<char>>(poVar12);
          paVar23 = &a;
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)&a);
          poVar12 = std::operator<<((ostream *)a.placeholder.field_2._M_local_buf,"Usage: ");
          std::operator<<(poVar12,(string *)&connectCmd);
          std::operator<<((ostream *)a.placeholder.field_2._M_local_buf," [OPTION...]");
          std::operator<<((ostream *)a.placeholder.field_2._M_local_buf,"\n");
          nonsugar::detail::lines<std::__cxx11::string>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&f_1,(detail *)&connectCmd.m_footer,s_08);
          pcVar20 = f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          for (psVar17 = (string *)
                         f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start; psVar17 != (string *)pcVar20;
              psVar17 = psVar17 + 0x20) {
            poVar12 = std::operator<<((ostream *)a.placeholder.field_2._M_local_buf,"  ");
            poVar12 = std::operator<<(poVar12,psVar17);
            std::operator<<(poVar12,"\n");
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&f_1);
          std::operator<<((ostream *)a.placeholder.field_2._M_local_buf,"\nOptions:\n");
          local_1888.
          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1888.
          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1888.
          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          nonsugar::detail::widen<std::__cxx11::string>((string *)&match,(detail *)", ",s_20);
          err._M_dataplus._M_p = (pointer)&err.field_2;
          err._M_string_length = 0;
          err.field_2._M_allocated_capacity = err.field_2._M_allocated_capacity & 0xffffffffffffff00
          ;
          bVar9 = true;
          pcVar16 = extraout_RDX_27;
          for (pcVar20 = connectCmd.m_flags.
                         super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                         .
                         super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_false>
                         ._M_head_impl.short_names.super__Vector_base<char,_std::allocator<char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              pcVar20 !=
              connectCmd.m_flags.
              super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
              .
              super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_false>
              ._M_head_impl.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish; pcVar20 = pcVar20 + 1) {
            if (!bVar9) {
              std::__cxx11::string::append((string *)&err);
              pcVar16 = extraout_RDX_28;
            }
            cVar3 = *pcVar20;
            nonsugar::detail::widen<std::__cxx11::string>((string *)&f_1,(detail *)0x138c42,pcVar16)
            ;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &help_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&f_1,cVar3);
            std::__cxx11::string::~string((string *)&f_1);
            std::__cxx11::string::append((string *)&err);
            std::__cxx11::string::~string((string *)&help_1);
            bVar9 = false;
            pcVar16 = extraout_RDX_29;
          }
          std::__cxx11::string::~string((string *)&match);
          nonsugar::detail::widen<std::__cxx11::string>(&name,(detail *)", ",s_21);
          match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&match.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)match.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
          bVar9 = true;
          pcVar16 = extraout_RDX_30;
          for (pbVar14 = connectCmd.m_flags.
                         super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                         .
                         super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_false>
                         ._M_head_impl.long_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pbVar14 !=
              connectCmd.m_flags.
              super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
              .
              super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_false>
              ._M_head_impl.long_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; pbVar14 = pbVar14 + 1) {
            if (!bVar9) {
              std::__cxx11::string::append((string *)&match);
              pcVar16 = extraout_RDX_31;
            }
            nonsugar::detail::widen<std::__cxx11::string>((string *)&f_1,(detail *)0x138290,pcVar16)
            ;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &help_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&f_1,pbVar14);
            std::__cxx11::string::~string((string *)&f_1);
            std::__cxx11::string::append((string *)&match);
            std::__cxx11::string::~string((string *)&help_1);
            bVar9 = false;
            pcVar16 = extraout_RDX_32;
          }
          std::__cxx11::string::~string((string *)&name);
          nonsugar::detail::lines<std::__cxx11::string>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&name,(detail *)
                              &connectCmd.m_flags.
                               super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                               .
                               super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_false>
                               ._M_head_impl.help,s_22);
          pbVar24 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    name._M_string_length;
          _Var19 = name._M_dataplus;
          if (name._M_dataplus._M_p == (pointer)name._M_string_length) {
            f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)&f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
            f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)((ulong)f_1.short_names.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage &
                          0xffffffffffffff00);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1);
            std::__cxx11::string::~string((string *)&f_1);
            pbVar24 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      name._M_string_length;
            _Var19 = name._M_dataplus;
          }
          bVar9 = true;
          for (; psVar22 = match.
                           super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var19._M_p !=
              pbVar24; _Var19._M_p = _Var19._M_p + 0x20) {
            if (bVar9) {
              std::
              vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              ::
              emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                        ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                          *)&local_1888,&err,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&match
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          _Var19._M_p);
            }
            else {
              f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage;
              f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)((ulong)f_1.short_names.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage &
                            0xffffffffffffff00);
              help_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&help_1.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              help_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              help_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
              std::
              vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              ::emplace_back<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string_const&>
                        ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                          *)&local_1888,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &help_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)_Var19._M_p);
              std::__cxx11::string::~string((string *)&help_1);
              std::__cxx11::string::~string((string *)&f_1);
            }
            bVar9 = false;
          }
          local_1900._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               err._M_string_length;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&name);
          std::__cxx11::string::~string((string *)&match);
          std::__cxx11::string::~string((string *)&err);
          nonsugar::detail::widen<std::__cxx11::string>
                    ((string *)&argument_args,(detail *)", ",s_23);
          args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&args.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_19d8 = (pointer)connectCmd.m_flags.
                                super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                                .
                                super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                                .
                                super__Head_base<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                ._M_head_impl.short_names.
                                super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish;
          bVar9 = true;
          pcVar16 = extraout_RDX_33;
          for (pcVar20 = connectCmd.m_flags.
                         super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                         .
                         super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                         .
                         super__Head_base<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                         ._M_head_impl.short_names.super__Vector_base<char,_std::allocator<char>_>.
                         _M_impl.super__Vector_impl_data._M_start; (pointer)pcVar20 != local_19d8;
              pcVar20 = pcVar20 + 1) {
            if (!bVar9) {
              std::__cxx11::string::append((string *)&args);
              pcVar16 = extraout_RDX_34;
            }
            cVar3 = *pcVar20;
            nonsugar::detail::widen<std::__cxx11::string>(&err,(detail *)0x138c42,pcVar16);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &help_1,&err,cVar3);
            nonsugar::detail::widen<std::__cxx11::string>((string *)&match,(detail *)0x138c93,s_24);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &help_1,(string *)&match);
            std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&f_1,
                           &connectCmd.m_flags.
                            super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                            .
                            super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                            .
                            super__Head_base<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                            ._M_head_impl.placeholder);
            std::__cxx11::string::~string((string *)&f_1);
            std::__cxx11::string::~string((string *)&match);
            std::__cxx11::string::~string((string *)&help_1);
            std::__cxx11::string::~string((string *)&err);
            std::__cxx11::string::append((string *)&args);
            std::__cxx11::string::~string((string *)&name);
            bVar9 = false;
            pcVar16 = extraout_RDX_35;
          }
          std::__cxx11::string::~string((string *)&argument_args);
          nonsugar::detail::widen<std::__cxx11::string>
                    ((string *)&partial_matches,(detail *)", ",s_25);
          argument_args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&argument_args.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          argument_args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          argument_args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)argument_args.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
          local_19d8 = connectCmd.m_flags.
                       super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                       .
                       super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                       .
                       super__Head_base<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                       ._M_head_impl.long_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          bVar9 = true;
          pcVar16 = extraout_RDX_36;
          for (pbVar14 = connectCmd.m_flags.
                         super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                         .
                         super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                         .
                         super__Head_base<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                         ._M_head_impl.long_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar14 != local_19d8;
              pbVar14 = pbVar14 + 1) {
            if (!bVar9) {
              std::__cxx11::string::append((string *)&argument_args);
              pcVar16 = extraout_RDX_37;
            }
            nonsugar::detail::widen<std::__cxx11::string>(&err,(detail *)0x138290,pcVar16);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &help_1,&err,pbVar14);
            nonsugar::detail::widen<std::__cxx11::string>((string *)&match,(detail *)"=",s_26);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &help_1,(string *)&match);
            std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&f_1,
                           &connectCmd.m_flags.
                            super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                            .
                            super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                            .
                            super__Head_base<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                            ._M_head_impl.placeholder);
            std::__cxx11::string::~string((string *)&f_1);
            std::__cxx11::string::~string((string *)&match);
            std::__cxx11::string::~string((string *)&help_1);
            std::__cxx11::string::~string((string *)&err);
            std::__cxx11::string::append((string *)&argument_args);
            std::__cxx11::string::~string((string *)&name);
            bVar9 = false;
            pcVar16 = extraout_RDX_38;
          }
          std::__cxx11::string::~string((string *)&partial_matches);
          nonsugar::detail::lines<std::__cxx11::string>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&err,(detail *)
                             &connectCmd.m_flags.
                              super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                              .
                              super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                              .
                              super__Head_base<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                              ._M_head_impl.help,s_27);
          if (err._M_dataplus._M_p == (pointer)err._M_string_length) {
            f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)&f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
            f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)((ulong)f_1.short_names.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage &
                          0xffffffffffffff00);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1);
            std::__cxx11::string::~string((string *)&f_1);
          }
          sVar21 = err._M_string_length;
          bVar9 = true;
          for (_Var19._M_p = err._M_dataplus._M_p; _Var19._M_p != (pointer)sVar21;
              _Var19._M_p = _Var19._M_p + 0x20) {
            if (bVar9) {
              std::
              vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              ::
              emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                        ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                          *)&local_1888,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &argument_args,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         _Var19._M_p);
            }
            else {
              f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage;
              f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)((ulong)f_1.short_names.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage &
                            0xffffffffffffff00);
              help_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&help_1.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              help_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              help_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
              std::
              vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              ::emplace_back<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string_const&>
                        ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                          *)&local_1888,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &help_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)_Var19._M_p);
              std::__cxx11::string::~string((string *)&help_1);
              std::__cxx11::string::~string((string *)&f_1);
            }
            bVar9 = false;
          }
          _Var13._M_current =
               args.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish < local_1900._M_current) {
            _Var13._M_current = local_1900._M_current;
          }
          pbVar14 = argument_args.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (argument_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish < psVar22) {
            pbVar14 = (pointer)psVar22;
          }
          local_1900._M_current = _Var13._M_current;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&err);
          std::__cxx11::string::~string((string *)&argument_args);
          std::__cxx11::string::~string((string *)&args);
          nonsugar::detail::widen<std::__cxx11::string>
                    ((string *)&argument_args,(detail *)", ",s_28);
          args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&args.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_19d8 = (pointer)connectCmd.m_flags.
                                super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                                .
                                super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                                .
                                super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                                .
                                super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
                                ._M_head_impl.short_names.
                                super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish;
          bVar9 = true;
          pcVar16 = extraout_RDX_39;
          for (pcVar20 = connectCmd.m_flags.
                         super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                         .
                         super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                         .
                         super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                         .
                         super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
                         ._M_head_impl.short_names.super__Vector_base<char,_std::allocator<char>_>.
                         _M_impl.super__Vector_impl_data._M_start; (pointer)pcVar20 != local_19d8;
              pcVar20 = pcVar20 + 1) {
            if (!bVar9) {
              std::__cxx11::string::append((string *)&args);
              pcVar16 = extraout_RDX_40;
            }
            cVar3 = *pcVar20;
            nonsugar::detail::widen<std::__cxx11::string>(&err,(detail *)0x138c42,pcVar16);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &help_1,&err,cVar3);
            nonsugar::detail::widen<std::__cxx11::string>((string *)&match,(detail *)0x138c93,s_29);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &help_1,(string *)&match);
            std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&f_1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&connectCmd.m_flags.
                                   super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                                   .
                                   super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                                   .
                                   super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                                   .
                                   super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
                                   ._M_head_impl + 0x30));
            std::__cxx11::string::~string((string *)&f_1);
            std::__cxx11::string::~string((string *)&match);
            std::__cxx11::string::~string((string *)&help_1);
            std::__cxx11::string::~string((string *)&err);
            std::__cxx11::string::append((string *)&args);
            std::__cxx11::string::~string((string *)&name);
            bVar9 = false;
            pcVar16 = extraout_RDX_41;
          }
          std::__cxx11::string::~string((string *)&argument_args);
          nonsugar::detail::widen<std::__cxx11::string>
                    ((string *)&partial_matches,(detail *)", ",s_30);
          argument_args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&argument_args.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          argument_args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          argument_args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)argument_args.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
          local_19d8 = connectCmd.m_flags.
                       super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                       .
                       super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                       .
                       super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                       .
                       super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
                       ._M_head_impl.long_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          bVar9 = true;
          pcVar16 = extraout_RDX_42;
          for (pbVar18 = connectCmd.m_flags.
                         super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                         .
                         super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                         .
                         super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                         .
                         super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
                         ._M_head_impl.long_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar18 != local_19d8;
              pbVar18 = pbVar18 + 1) {
            if (!bVar9) {
              std::__cxx11::string::append((string *)&argument_args);
              pcVar16 = extraout_RDX_43;
            }
            nonsugar::detail::widen<std::__cxx11::string>(&err,(detail *)0x138290,pcVar16);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &help_1,&err,pbVar18);
            nonsugar::detail::widen<std::__cxx11::string>((string *)&match,(detail *)"=",s_31);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &help_1,(string *)&match);
            std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&f_1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&connectCmd.m_flags.
                                   super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                                   .
                                   super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                                   .
                                   super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                                   .
                                   super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
                                   ._M_head_impl + 0x30));
            std::__cxx11::string::~string((string *)&f_1);
            std::__cxx11::string::~string((string *)&match);
            std::__cxx11::string::~string((string *)&help_1);
            std::__cxx11::string::~string((string *)&err);
            std::__cxx11::string::append((string *)&argument_args);
            std::__cxx11::string::~string((string *)&name);
            bVar9 = false;
            pcVar16 = extraout_RDX_44;
          }
          std::__cxx11::string::~string((string *)&partial_matches);
          nonsugar::detail::lines<std::__cxx11::string>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&err,(detail *)
                             ((long)&connectCmd.m_flags.
                                     super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                                     .
                                     super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                                     .
                                     super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>
                                     .
                                     super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>,_false>
                                     ._M_head_impl + 0x50),s_32);
          if (err._M_dataplus._M_p == (pointer)err._M_string_length) {
            f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)&f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
            f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)((ulong)f_1.short_names.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage &
                          0xffffffffffffff00);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1);
            std::__cxx11::string::~string((string *)&f_1);
          }
          sVar21 = err._M_string_length;
          bVar9 = true;
          for (_Var19._M_p = err._M_dataplus._M_p; _Var19._M_p != (pointer)sVar21;
              _Var19._M_p = _Var19._M_p + 0x20) {
            if (bVar9) {
              std::
              vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              ::
              emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                        ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                          *)&local_1888,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &argument_args,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         _Var19._M_p);
            }
            else {
              f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage;
              f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)((ulong)f_1.short_names.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage &
                            0xffffffffffffff00);
              help_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&help_1.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              help_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              help_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
              std::
              vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              ::emplace_back<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string_const&>
                        ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                          *)&local_1888,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &help_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)_Var19._M_p);
              std::__cxx11::string::~string((string *)&help_1);
              std::__cxx11::string::~string((string *)&f_1);
            }
            bVar9 = false;
          }
          _Var13._M_current =
               args.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish < local_1900._M_current) {
            _Var13._M_current = local_1900._M_current;
          }
          pbVar18 = argument_args.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (argument_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish < pbVar14) {
            pbVar18 = pbVar14;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&err);
          std::__cxx11::string::~string((string *)&argument_args);
          std::__cxx11::string::~string((string *)&args);
          local_19d8 = (pointer)local_1888.
                                super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar14 = (pointer)local_1888.
                                  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start; pbVar14 != local_19d8;
              pbVar14 = pbVar14 + 3) {
            poVar12 = std::operator<<((ostream *)a.placeholder.field_2._M_local_buf,"  ");
            std::operator<<(poVar12,(string *)(pbVar14 + 2));
            for (pbVar24 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pbVar14[2]._M_string_length; pbVar24 < _Var13._M_current;
                pbVar24 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&(pbVar24->_M_dataplus)._M_p + 1)) {
              std::operator<<((ostream *)a.placeholder.field_2._M_local_buf," ");
            }
            poVar12 = std::operator<<((ostream *)a.placeholder.field_2._M_local_buf,"  ");
            std::operator<<(poVar12,(string *)(pbVar14 + 1));
            for (pbVar25 = (pointer)pbVar14[1]._M_string_length; pbVar25 < pbVar18;
                pbVar25 = (pointer)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)&pbVar25->_M_dataplus)->first)._M_current + 1)) {
              std::operator<<((ostream *)a.placeholder.field_2._M_local_buf," ");
            }
            poVar12 = std::operator<<((ostream *)a.placeholder.field_2._M_local_buf,"  ");
            poVar12 = std::operator<<(poVar12,(string *)pbVar14);
            std::operator<<(poVar12,"\n");
          }
          std::
          vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_1888);
          std::__cxx11::stringbuf::str();
          std::__cxx11::stringstream::~stringstream((stringstream *)&a);
          poVar12 = std::operator<<((ostream *)&std::cout,(string *)&subcommand_arg);
          std::endl<char,std::char_traits<char>>(poVar12);
          paVar23 = (argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&subcommand_arg;
        }
        std::__cxx11::string::~string((string *)paVar23);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&connectOpts.
                super___shared_ptr<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  else {
    nonsugar::detail::
    copy_shared<nonsugar::option_map<main::GreetOption,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)2,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>>
              ((detail *)&greetOpts,
               (option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3e8._16_8_);
    if (greetOpts.
        super___shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) goto LAB_00121c85;
    if (((greetOpts.
          super___shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super_option_pair<GreetOption,_(GreetOption)0,_void>).value.
        super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
      std::__cxx11::string::string
                ((string *)&help_1,
                 (string *)
                 ((greetOpts.
                   super___shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->
                 super_option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).value.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help_1,
                     ", ");
      std::__cxx11::string::string
                ((string *)&err,
                 (string *)
                 ((greetOpts.
                   super___shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->
                 super_option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).value.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      std::operator+(&a.placeholder,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,&err)
      ;
      std::__cxx11::string::~string((string *)&err);
      std::__cxx11::string::~string((string *)&f_1);
      std::__cxx11::string::~string((string *)&help_1);
      peVar4 = ((greetOpts.
                 super___shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super_option_pair<GreetOption,_(GreetOption)2,_void>).value.
               super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar4 == (element_type *)0x0) {
        std::__cxx11::string::string((string *)&f_1,(string *)&a);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help_1,
                       "*** ",&a.placeholder);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help_1,
                       " ***");
      }
      poVar12 = std::operator<<((ostream *)&std::cout,(string *)&f_1);
      std::endl<char,std::char_traits<char>>(poVar12);
      std::__cxx11::string::~string((string *)&f_1);
      if (peVar4 != (element_type *)0x0) {
        std::__cxx11::string::~string((string *)&help_1);
      }
      paVar23 = &a;
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&a);
      poVar12 = std::operator<<((ostream *)a.placeholder.field_2._M_local_buf,"Usage: ");
      std::operator<<(poVar12,(string *)&greetCmd);
      std::operator<<((ostream *)a.placeholder.field_2._M_local_buf," [OPTION...]");
      poVar12 = std::operator<<((ostream *)a.placeholder.field_2._M_local_buf," ");
      std::operator<<(poVar12,(string *)&greetCmd.m_arguments);
      std::operator<<((ostream *)a.placeholder.field_2._M_local_buf,"\n");
      nonsugar::detail::lines<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&f_1,(detail *)&greetCmd.m_footer,s_07);
      pcVar20 = f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (psVar17 = (string *)
                     f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start; psVar17 != (string *)pcVar20;
          psVar17 = psVar17 + 0x20) {
        poVar12 = std::operator<<((ostream *)a.placeholder.field_2._M_local_buf,"  ");
        poVar12 = std::operator<<(poVar12,psVar17);
        std::operator<<(poVar12,"\n");
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&f_1);
      std::operator<<((ostream *)a.placeholder.field_2._M_local_buf,"\nOptions:\n");
      local_1888.
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1888.
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1888.
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      nonsugar::detail::widen<std::__cxx11::string>((string *)&match,(detail *)", ",s_09);
      err._M_dataplus._M_p = (pointer)&err.field_2;
      err._M_string_length = 0;
      err.field_2._M_allocated_capacity = err.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bVar9 = true;
      pcVar16 = extraout_RDX_09;
      for (pcVar20 = greetCmd.m_flags.
                     super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                     .
                     super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_false>
                     ._M_head_impl.short_names.super__Vector_base<char,_std::allocator<char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pcVar20 !=
          greetCmd.m_flags.
          super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
          .
          super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_false>
          ._M_head_impl.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish; pcVar20 = pcVar20 + 1) {
        if (!bVar9) {
          std::__cxx11::string::append((string *)&err);
          pcVar16 = extraout_RDX_10;
        }
        cVar3 = *pcVar20;
        nonsugar::detail::widen<std::__cxx11::string>((string *)&f_1,(detail *)0x138c42,pcVar16);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                       cVar3);
        std::__cxx11::string::~string((string *)&f_1);
        std::__cxx11::string::append((string *)&err);
        std::__cxx11::string::~string((string *)&help_1);
        bVar9 = false;
        pcVar16 = extraout_RDX_11;
      }
      std::__cxx11::string::~string((string *)&match);
      nonsugar::detail::widen<std::__cxx11::string>(&name,(detail *)", ",s_10);
      match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&match.
                     super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)match.
                            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00)
      ;
      bVar9 = true;
      pcVar16 = extraout_RDX_12;
      for (pbVar14 = greetCmd.m_flags.
                     super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                     .
                     super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_false>
                     ._M_head_impl.long_names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar14 !=
          greetCmd.m_flags.
          super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
          .
          super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_false>
          ._M_head_impl.long_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar14 = pbVar14 + 1) {
        if (!bVar9) {
          std::__cxx11::string::append((string *)&match);
          pcVar16 = extraout_RDX_13;
        }
        nonsugar::detail::widen<std::__cxx11::string>((string *)&f_1,(detail *)0x138290,pcVar16);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                       pbVar14);
        std::__cxx11::string::~string((string *)&f_1);
        std::__cxx11::string::append((string *)&match);
        std::__cxx11::string::~string((string *)&help_1);
        bVar9 = false;
        pcVar16 = extraout_RDX_14;
      }
      std::__cxx11::string::~string((string *)&name);
      nonsugar::detail::lines<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&name,(detail *)
                          &greetCmd.m_flags.
                           super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                           .
                           super__Head_base<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_false>
                           ._M_head_impl.help,s_11);
      if (name._M_dataplus._M_p == (pointer)name._M_string_length) {
        f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)f_1.short_names.super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00
                      );
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1);
        std::__cxx11::string::~string((string *)&f_1);
      }
      sVar21 = name._M_string_length;
      bVar9 = true;
      for (_Var19._M_p = name._M_dataplus._M_p;
          psVar22 = match.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish, _Var19._M_p != (pointer)sVar21;
          _Var19._M_p = _Var19._M_p + 0x20) {
        if (bVar9) {
          std::
          vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
          ::
          emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                      *)&local_1888,&err,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&match,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Var19._M_p);
        }
        else {
          f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)f_1.short_names.super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
          help_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&help_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          help_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          help_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          std::
          vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string_const&>
                    ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                      *)&local_1888,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Var19._M_p);
          std::__cxx11::string::~string((string *)&help_1);
          std::__cxx11::string::~string((string *)&f_1);
        }
        bVar9 = false;
      }
      local_1900._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err._M_string_length
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&name);
      std::__cxx11::string::~string((string *)&match);
      std::__cxx11::string::~string((string *)&err);
      nonsugar::detail::widen<std::__cxx11::string>((string *)&argument_args,(detail *)", ",s_12);
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_19d8 = (pointer)greetCmd.m_flags.
                            super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                            .
                            super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                            .
                            super__Head_base<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                            ._M_head_impl.short_names.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish;
      bVar9 = true;
      pcVar16 = extraout_RDX_15;
      for (pcVar20 = greetCmd.m_flags.
                     super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                     .
                     super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                     .
                     super__Head_base<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                     ._M_head_impl.short_names.super__Vector_base<char,_std::allocator<char>_>.
                     _M_impl.super__Vector_impl_data._M_start; (pointer)pcVar20 != local_19d8;
          pcVar20 = pcVar20 + 1) {
        if (!bVar9) {
          std::__cxx11::string::append((string *)&args);
          pcVar16 = extraout_RDX_16;
        }
        cVar3 = *pcVar20;
        nonsugar::detail::widen<std::__cxx11::string>(&err,(detail *)0x138c42,pcVar16);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help_1,
                       &err,cVar3);
        nonsugar::detail::widen<std::__cxx11::string>((string *)&match,(detail *)0x138c93,s_13);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help_1,
                       (string *)&match);
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &f_1,
                       &greetCmd.m_flags.
                        super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                        .
                        super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                        .
                        super__Head_base<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                        ._M_head_impl.placeholder);
        std::__cxx11::string::~string((string *)&f_1);
        std::__cxx11::string::~string((string *)&match);
        std::__cxx11::string::~string((string *)&help_1);
        std::__cxx11::string::~string((string *)&err);
        std::__cxx11::string::append((string *)&args);
        std::__cxx11::string::~string((string *)&name);
        bVar9 = false;
        pcVar16 = extraout_RDX_17;
      }
      std::__cxx11::string::~string((string *)&argument_args);
      nonsugar::detail::widen<std::__cxx11::string>((string *)&partial_matches,(detail *)", ",s_14);
      argument_args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&argument_args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      argument_args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      argument_args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)argument_args.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00)
      ;
      local_19d8 = greetCmd.m_flags.
                   super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                   .
                   super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                   .
                   super__Head_base<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                   ._M_head_impl.long_names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      bVar9 = true;
      pcVar16 = extraout_RDX_18;
      for (pbVar14 = greetCmd.m_flags.
                     super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                     .
                     super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                     .
                     super__Head_base<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                     ._M_head_impl.long_names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar14 != local_19d8;
          pbVar14 = pbVar14 + 1) {
        if (!bVar9) {
          std::__cxx11::string::append((string *)&argument_args);
          pcVar16 = extraout_RDX_19;
        }
        nonsugar::detail::widen<std::__cxx11::string>(&err,(detail *)0x138290,pcVar16);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help_1,
                       &err,pbVar14);
        nonsugar::detail::widen<std::__cxx11::string>((string *)&match,(detail *)"=",s_15);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help_1,
                       (string *)&match);
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &f_1,
                       &greetCmd.m_flags.
                        super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                        .
                        super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                        .
                        super__Head_base<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                        ._M_head_impl.placeholder);
        std::__cxx11::string::~string((string *)&f_1);
        std::__cxx11::string::~string((string *)&match);
        std::__cxx11::string::~string((string *)&help_1);
        std::__cxx11::string::~string((string *)&err);
        std::__cxx11::string::append((string *)&argument_args);
        std::__cxx11::string::~string((string *)&name);
        bVar9 = false;
        pcVar16 = extraout_RDX_20;
      }
      std::__cxx11::string::~string((string *)&partial_matches);
      nonsugar::detail::lines<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&err,(detail *)
                         &greetCmd.m_flags.
                          super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                          .
                          super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                          .
                          super__Head_base<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                          ._M_head_impl.help,s_16);
      if (err._M_dataplus._M_p == (pointer)err._M_string_length) {
        f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)f_1.short_names.super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00
                      );
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&err,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1);
        std::__cxx11::string::~string((string *)&f_1);
      }
      sVar21 = err._M_string_length;
      bVar9 = true;
      for (_Var19._M_p = err._M_dataplus._M_p; _Var19._M_p != (pointer)sVar21;
          _Var19._M_p = _Var19._M_p + 0x20) {
        if (bVar9) {
          std::
          vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
          ::
          emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                      *)&local_1888,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &argument_args,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Var19._M_p);
        }
        else {
          f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)f_1.short_names.super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
          help_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&help_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          help_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          help_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          std::
          vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string_const&>
                    ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                      *)&local_1888,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Var19._M_p);
          std::__cxx11::string::~string((string *)&help_1);
          std::__cxx11::string::~string((string *)&f_1);
        }
        bVar9 = false;
      }
      local_19d8 = args.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      if (args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish < local_1900._M_current) {
        local_19d8 = (pointer)local_1900;
      }
      pbVar14 = argument_args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (argument_args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish < psVar22) {
        pbVar14 = (pointer)psVar22;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&err);
      std::__cxx11::string::~string((string *)&argument_args);
      std::__cxx11::string::~string((string *)&args);
      nonsugar::detail::widen<std::__cxx11::string>((string *)&match,(detail *)", ",s_17);
      err._M_dataplus._M_p = (pointer)&err.field_2;
      err._M_string_length = 0;
      err.field_2._M_allocated_capacity = err.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bVar9 = true;
      pcVar16 = extraout_RDX_21;
      for (pcVar20 = greetCmd.m_flags.
                     super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                     .
                     super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                     .
                     super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                     .
                     super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>,_false>
                     ._M_head_impl.short_names.super__Vector_base<char,_std::allocator<char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pcVar20 !=
          greetCmd.m_flags.
          super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
          .
          super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
          .
          super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
          .
          super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>,_false>
          ._M_head_impl.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish; pcVar20 = pcVar20 + 1) {
        if (!bVar9) {
          std::__cxx11::string::append((string *)&err);
          pcVar16 = extraout_RDX_22;
        }
        cVar3 = *pcVar20;
        nonsugar::detail::widen<std::__cxx11::string>((string *)&f_1,(detail *)0x138c42,pcVar16);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                       cVar3);
        std::__cxx11::string::~string((string *)&f_1);
        std::__cxx11::string::append((string *)&err);
        std::__cxx11::string::~string((string *)&help_1);
        bVar9 = false;
        pcVar16 = extraout_RDX_23;
      }
      std::__cxx11::string::~string((string *)&match);
      nonsugar::detail::widen<std::__cxx11::string>(&name,(detail *)", ",s_18);
      match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&match.
                     super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)match.
                            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00)
      ;
      bVar9 = true;
      pcVar16 = extraout_RDX_24;
      for (pbVar18 = greetCmd.m_flags.
                     super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                     .
                     super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                     .
                     super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                     .
                     super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>,_false>
                     ._M_head_impl.long_names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar18 !=
          greetCmd.m_flags.
          super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
          .
          super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
          .
          super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
          .
          super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>,_false>
          ._M_head_impl.long_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar18 = pbVar18 + 1) {
        if (!bVar9) {
          std::__cxx11::string::append((string *)&match);
          pcVar16 = extraout_RDX_25;
        }
        nonsugar::detail::widen<std::__cxx11::string>((string *)&f_1,(detail *)0x138290,pcVar16);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                       pbVar18);
        std::__cxx11::string::~string((string *)&f_1);
        std::__cxx11::string::append((string *)&match);
        std::__cxx11::string::~string((string *)&help_1);
        bVar9 = false;
        pcVar16 = extraout_RDX_26;
      }
      std::__cxx11::string::~string((string *)&name);
      nonsugar::detail::lines<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&name,(detail *)
                          ((long)&greetCmd.m_flags.
                                  super__Tuple_impl<0UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                                  .
                                  super__Tuple_impl<1UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                                  .
                                  super__Tuple_impl<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>
                                  .
                                  super__Head_base<2UL,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>,_false>
                                  ._M_head_impl + 0x50),s_19);
      pbVar24 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                name._M_string_length;
      _Var19 = name._M_dataplus;
      if (name._M_dataplus._M_p == (pointer)name._M_string_length) {
        f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)f_1.short_names.super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00
                      );
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1);
        std::__cxx11::string::~string((string *)&f_1);
        pbVar24 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  name._M_string_length;
        _Var19 = name._M_dataplus;
      }
      bVar9 = true;
      for (; (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var19._M_p !=
             pbVar24; _Var19._M_p = _Var19._M_p + 0x20) {
        if (bVar9) {
          std::
          vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
          ::
          emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                      *)&local_1888,&err,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&match,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Var19._M_p);
        }
        else {
          f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          f_1.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)f_1.short_names.super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
          help_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&help_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          help_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          help_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          std::
          vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string_const&>
                    ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                      *)&local_1888,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Var19._M_p);
          std::__cxx11::string::~string((string *)&help_1);
          std::__cxx11::string::~string((string *)&f_1);
        }
        bVar9 = false;
      }
      pbVar18 = (pointer)err._M_string_length;
      if (err._M_string_length < local_19d8) {
        pbVar18 = local_19d8;
      }
      pbVar25 = (pointer)match.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
      if (match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish < pbVar14) {
        pbVar25 = pbVar14;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&name);
      std::__cxx11::string::~string((string *)&match);
      std::__cxx11::string::~string((string *)&err);
      local_19d8 = (pointer)local_1888.
                            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar14 = (pointer)local_1888.
                              super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start; pbVar14 != local_19d8;
          pbVar14 = pbVar14 + 3) {
        poVar12 = std::operator<<((ostream *)a.placeholder.field_2._M_local_buf,"  ");
        std::operator<<(poVar12,(string *)(pbVar14 + 2));
        for (pbVar24 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       pbVar14[2]._M_string_length; pbVar24 < pbVar18;
            pbVar24 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&(pbVar24->_M_dataplus)._M_p + 1)) {
          std::operator<<((ostream *)a.placeholder.field_2._M_local_buf," ");
        }
        poVar12 = std::operator<<((ostream *)a.placeholder.field_2._M_local_buf,"  ");
        std::operator<<(poVar12,(string *)(pbVar14 + 1));
        for (pbVar29 = (pointer)pbVar14[1]._M_string_length; pbVar29 < pbVar25;
            pbVar29 = (pointer)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)&pbVar29->_M_dataplus)->first)._M_current + 1)) {
          std::operator<<((ostream *)a.placeholder.field_2._M_local_buf," ");
        }
        poVar12 = std::operator<<((ostream *)a.placeholder.field_2._M_local_buf,"  ");
        poVar12 = std::operator<<(poVar12,(string *)pbVar14);
        std::operator<<(poVar12,"\n");
      }
      std::
      vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_1888);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)&a);
      poVar12 = std::operator<<((ostream *)&std::cout,(string *)&subcommand_arg);
      std::endl<char,std::char_traits<char>>(poVar12);
      paVar23 = (argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&subcommand_arg;
    }
    std::__cxx11::string::~string((string *)paVar23);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&greetOpts.
              super___shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
LAB_001235e4:
  nonsugar::
  option_map<Option,_nonsugar::detail::option_pair<Option,_(Option)0,_void>,_nonsugar::detail::option_pair<Option,_(Option)1,_nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_nonsugar::detail::option_pair<Option,_(Option)2,_nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>_>_>
  ::~option_map((option_map<Option,_nonsugar::detail::option_pair<Option,_(Option)0,_void>,_nonsugar::detail::option_pair<Option,_(Option)1,_nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_nonsugar::detail::option_pair<Option,_(Option)2,_nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>_>_>
                 *)local_3e8);
  nonsugar::basic_command<$2815e3e1$>::~basic_command(&cmd);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&connectCmd);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~basic_command(&greetCmd);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    using namespace nonsugar;

    enum class Option { Help, Greet, Connect };
    enum class GreetOption { Help, Message, Decorate, Name };
    enum class ConnectOption { Help, Host, Port };

    auto const greetCmd = command<GreetOption>("subcmd_od greet", "Greeting command")
        .flag<GreetOption::Help>({'?'}, {"help"}, "", "display this help and exit", flag_type::exclusive)
        .flag<GreetOption::Message, std::string>({'g'}, {"greet"}, "STRING", "greeting message", "Hello")
        .flag<GreetOption::Decorate>({}, {"decorate"}, "", "decorate message")
        .argument<GreetOption::Name, std::string>("NAME")
        ;
    auto const connectCmd = command<ConnectOption>("subcmd_od connect", "Connect command")
        .flag<ConnectOption::Help>({'?'}, {"help"}, "", "display this help and exit", flag_type::exclusive)
        .flag<ConnectOption::Host, std::string>({'h'}, {"host"}, "HOST", "host name", "localhost")
        .flag<ConnectOption::Port, int>({'p'}, {"port"}, "PORT", "port number", 8080)
        ;
    auto const cmd = command<Option>("subcmd_od", "Test program for sub commands")
        .flag<Option::Help>({'?'}, {"help"}, "", "display this help and exit", flag_type::exclusive)
        .subcommand<Option::Greet>("greet", "Greeting command", greetCmd)
        .subcommand<Option::Connect>("connect", "Connect command", connectCmd)
        ;

    try {
        auto const opts = parse(argc, argv, cmd);
        if (opts.has<Option::Help>()) {
            std::cout << usage(cmd) << std::endl;
        } else if (auto const greetOpts = opts.get_shared<Option::Greet>()) {
            if (greetOpts->has<GreetOption::Help>()) {
                std::cout << usage(greetCmd) << std::endl;
            } else {
                auto const x = greetOpts->get<GreetOption::Message>() + ", " + greetOpts->get<GreetOption::Name>();
                std::cout << (greetOpts->has<GreetOption::Decorate>() ? "*** " + x + " ***" : x) << std::endl;
            }
        } else if (auto const connectOpts = opts.get_shared<Option::Connect>()) {
            if (connectOpts->has<ConnectOption::Help>()) {
                std::cout << usage(connectCmd) << std::endl;
            } else {
                auto const addr = connectOpts->get<ConnectOption::Host>() + ":" + std::to_string(connectOpts->get<ConnectOption::Port>());
                std::cout << "connect to " << addr << std::endl;
            }
        }
    } catch (error const &e) {
        std::cerr << e.message() << std::endl;
    }
}